

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenSSLWraper.cpp
# Opt level: O0

void __thiscall OpenSSLWrapper::InitOpenSSL::InitOpenSSL(InitOpenSSL *this)

{
  char *pcVar1;
  InitOpenSSL *this_local;
  
  std::__cxx11::string::string((string *)this);
  pcVar1 = (char *)OpenSSL_version(0);
  std::__cxx11::string::operator=((string *)this,pcVar1);
  return;
}

Assistant:

InitOpenSSL::InitOpenSSL()
    {
#if OPENSSL_VERSION_NUMBER < 0x10100000L
        SSL_library_init();
        SSL_load_error_strings();
        strVersion = SSLeay_version(SSLEAY_VERSION);
#else
        strVersion = OpenSSL_version(OPENSSL_VERSION);
#endif

#if OPENSSL_VERSION_NUMBER < 0x10100000L
        ERR_load_BIO_strings();
        OpenSSL_add_all_algorithms();

        m_pmutLocks = make_unique<mutex[]>(CRYPTO_num_locks());
        CRYPTO_set_locking_callback(CbLocking);
#endif
    }